

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

_Bool termchars_equal_override(termchar *a,termchar *b,unsigned_long bchr,unsigned_long battr)

{
  bool bVar1;
  unsigned_long battr_local;
  unsigned_long bchr_local;
  termchar *b_local;
  termchar *a_local;
  
  if ((((((((a->truecolour).fg.enabled & 1U) == ((b->truecolour).fg.enabled & 1U)) &&
         ((a->truecolour).fg.r == (b->truecolour).fg.r)) &&
        ((a->truecolour).fg.g == (b->truecolour).fg.g)) &&
       (((a->truecolour).fg.b == (b->truecolour).fg.b &&
        (((a->truecolour).bg.enabled & 1U) == ((b->truecolour).bg.enabled & 1U))))) &&
      (((a->truecolour).bg.r == (b->truecolour).bg.r &&
       (((a->truecolour).bg.g == (b->truecolour).bg.g &&
        ((a->truecolour).bg.b == (b->truecolour).bg.b)))))) &&
     ((a->chr == bchr &&
      (bchr_local = (unsigned_long)b, b_local = a,
      (a->attr & 0xffffffff0fffffff) == (battr & 0xffffffff0fffffff))))) {
    do {
      bVar1 = true;
      if (b_local->cc_next == L'\0') {
        bVar1 = *(int *)(bchr_local + 0x18) != 0;
      }
      if (!bVar1) {
        return true;
      }
      if ((b_local->cc_next == L'\0') || (*(int *)(bchr_local + 0x18) == 0)) {
        return false;
      }
      b_local = b_local + b_local->cc_next;
      bchr_local = bchr_local + (long)*(int *)(bchr_local + 0x18) * 0x20;
    } while (b_local->chr == *(unsigned_long *)bchr_local);
  }
  return false;
}

Assistant:

static bool termchars_equal_override(termchar *a, termchar *b,
                                     unsigned long bchr, unsigned long battr)
{
    /* FULL-TERMCHAR */
    if (!truecolour_equal(a->truecolour, b->truecolour))
        return false;
    if (a->chr != bchr)
        return false;
    if ((a->attr &~ DATTR_MASK) != (battr &~ DATTR_MASK))
        return false;
    while (a->cc_next || b->cc_next) {
        if (!a->cc_next || !b->cc_next)
            return false;              /* one cc-list ends, other does not */
        a += a->cc_next;
        b += b->cc_next;
        if (a->chr != b->chr)
            return false;
    }
    return true;
}